

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve25519_64_adx.h
# Opt level: O0

void fe4_cswap(uint64_t *out1,uint64_t *out2,fiat_uint1 arg1,uint64_t *arg2,uint64_t *arg3)

{
  uint64_t local_70;
  uint64_t x8;
  uint64_t x7;
  uint64_t x6;
  uint64_t x5;
  uint64_t x4;
  uint64_t x3;
  uint64_t x2;
  uint64_t x1;
  uint64_t *arg3_local;
  uint64_t *arg2_local;
  uint64_t *puStack_18;
  fiat_uint1 arg1_local;
  uint64_t *out2_local;
  uint64_t *out1_local;
  
  x1 = (uint64_t)arg3;
  arg3_local = arg2;
  arg2_local._7_1_ = arg1;
  puStack_18 = out2;
  out2_local = out1;
  fiat_cmovznz_u64(&x2,arg1,*arg2,*arg3);
  fiat_cmovznz_u64(&x3,arg2_local._7_1_,arg3_local[1],*(uint64_t *)(x1 + 8));
  fiat_cmovznz_u64(&x4,arg2_local._7_1_,arg3_local[2],*(uint64_t *)(x1 + 0x10));
  fiat_cmovznz_u64(&x5,arg2_local._7_1_,arg3_local[3],*(uint64_t *)(x1 + 0x18));
  fiat_cmovznz_u64(&x6,arg2_local._7_1_,*(uint64_t *)x1,*arg3_local);
  fiat_cmovznz_u64(&x7,arg2_local._7_1_,*(uint64_t *)(x1 + 8),arg3_local[1]);
  fiat_cmovznz_u64(&x8,arg2_local._7_1_,*(uint64_t *)(x1 + 0x10),arg3_local[2]);
  fiat_cmovznz_u64(&local_70,arg2_local._7_1_,*(uint64_t *)(x1 + 0x18),arg3_local[3]);
  *out2_local = x2;
  out2_local[1] = x3;
  out2_local[2] = x4;
  out2_local[3] = x5;
  *puStack_18 = x6;
  puStack_18[1] = x7;
  puStack_18[2] = x8;
  puStack_18[3] = local_70;
  return;
}

Assistant:

__attribute__((target("adx,bmi2")))
static void fe4_cswap(uint64_t out1[4], uint64_t out2[4], fiat_uint1 arg1, const uint64_t arg2[4], const uint64_t arg3[4]) {
  uint64_t x1;
  uint64_t x2;
  uint64_t x3;
  uint64_t x4;
  uint64_t x5;
  uint64_t x6;
  uint64_t x7;
  uint64_t x8;
  // NOTE: clang 14 for Zen 2 uses YMM registers
  fiat_cmovznz_u64(&x1, arg1, (arg2[0]), (arg3[0]));
  fiat_cmovznz_u64(&x2, arg1, (arg2[1]), (arg3[1]));
  fiat_cmovznz_u64(&x3, arg1, (arg2[2]), (arg3[2]));
  fiat_cmovznz_u64(&x4, arg1, (arg2[3]), (arg3[3]));
  fiat_cmovznz_u64(&x5, arg1, (arg3[0]), (arg2[0]));
  fiat_cmovznz_u64(&x6, arg1, (arg3[1]), (arg2[1]));
  fiat_cmovznz_u64(&x7, arg1, (arg3[2]), (arg2[2]));
  fiat_cmovznz_u64(&x8, arg1, (arg3[3]), (arg2[3]));
  out1[0] = x1;
  out1[1] = x2;
  out1[2] = x3;
  out1[3] = x4;
  out2[0] = x5;
  out2[1] = x6;
  out2[2] = x7;
  out2[3] = x8;
}